

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::SoftSign::backward_impl
          (SoftSign *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float fVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  float fVar11;
  
  uVar9 = (ulong)(fx->d).nd;
  iVar7 = 1;
  iVar5 = 1;
  if (uVar9 != 0) {
    uVar10 = 0;
    do {
      iVar5 = iVar5 * (fx->d).d[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  uVar6 = iVar5 * (fx->d).bd;
  uVar9 = (ulong)(dEdf->d).nd;
  if (uVar9 != 0) {
    iVar7 = 1;
    uVar10 = 0;
    do {
      iVar7 = iVar7 * (dEdf->d).d[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  if (uVar6 == iVar7 * (dEdf->d).bd) {
    uVar9 = (ulong)(dEdxi->d).nd;
    iVar5 = 1;
    if (uVar9 != 0) {
      uVar10 = 0;
      do {
        iVar5 = iVar5 * (dEdxi->d).d[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
    uVar8 = iVar5 * (dEdxi->d).bd;
    if (uVar8 == uVar6) {
      if (uVar6 != 0) {
        pfVar2 = fx->v;
        pfVar3 = dEdf->v;
        pfVar4 = dEdxi->v;
        uVar9 = 0;
        do {
          fVar1 = pfVar2[uVar9];
          fVar11 = -fVar1;
          if (-fVar1 <= fVar1) {
            fVar11 = fVar1;
          }
          pfVar4[uVar9] = (1.0 - fVar11) * (1.0 - fVar11) * pfVar3[uVar9] + pfVar4[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
      return;
    }
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<cnn::FSoftSignBackward, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                 );
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                "Eigen::CwiseBinaryOp<cnn::FSoftSignBackward, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = cnn::FSoftSignBackward, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
               );
}

Assistant:

void SoftSign::backward_impl(const vector<const Tensor*>& xs,
                        const Tensor& fx,
                        const Tensor& dEdf,
                        unsigned i,
                        Tensor& dEdxi) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("SoftSign not yet implemented for CUDA");
#else
  dEdxi.vec() += fx.vec().binaryExpr(dEdf.vec(), FSoftSignBackward());
#endif
}